

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O1

void Cmd_quicksave(FCommandLine *argv,APlayerPawn *who,int key)

{
  DMenu *menu;
  FSoundID local_20;
  FName local_1c;
  FSoundID local_18;
  FSoundID local_14;
  
  if ((usergame) && ((0 < (int)(&DAT_017e5ee8)[(long)consoleplayer * 0xa8] || (multiplayer)))) {
    if (gamestate == GS_LEVEL) {
      if (quickSaveSlot == (FSaveGameNode *)0x0) {
        local_18.ID = S_FindSound("menu/activate");
        S_Sound(0x22,&local_18,snd_menuvolume.Value,0.0);
        M_StartControlPanel(false);
        local_1c.Index = 0x1fc;
        M_SetMenu(&local_1c,-1);
      }
      else {
        if (!saveloadconfirmation.Value) {
          G_SaveGame((quickSaveSlot->Filename).Chars,quickSaveSlot->Title);
          return;
        }
        local_20.ID = S_FindSound("menu/activate");
        S_Sound(0x22,&local_20,snd_menuvolume.Value,0.0);
        menu = (DMenu *)M_Malloc_Dbg(0x50,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                                     ,0x1f9);
        DQuickSaveMenu::DQuickSaveMenu((DQuickSaveMenu *)menu,false);
        (menu->mParentMenu).field_0.p = DMenu::CurrentMenu;
        M_ActivateMenu(menu);
      }
    }
  }
  else {
    local_14.ID = S_FindSound("menu/invalid");
    S_Sound(0x22,&local_14,snd_menuvolume.Value,0.0);
  }
  return;
}

Assistant:

CCMD (quicksave)
{	// F6
	if (!usergame || (players[consoleplayer].health <= 0 && !multiplayer))
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/invalid", snd_menuvolume, ATTN_NONE);
		return;
	}

	if (gamestate != GS_LEVEL)
		return;
		
	if (quickSaveSlot == NULL)
	{
		S_Sound(CHAN_VOICE | CHAN_UI, "menu/activate", snd_menuvolume, ATTN_NONE);
		M_StartControlPanel(false);
		M_SetMenu(NAME_Savegamemenu);
		return;
	}
	
	// [mxd]. Just save the game, no questions asked.
	if (!saveloadconfirmation)
	{
		G_SaveGame(quickSaveSlot->Filename.GetChars(), quickSaveSlot->Title);
		return;
	}

	S_Sound(CHAN_VOICE | CHAN_UI, "menu/activate", snd_menuvolume, ATTN_NONE);
	DMenu *newmenu = new DQuickSaveMenu(false);
	newmenu->mParentMenu = DMenu::CurrentMenu;
	M_ActivateMenu(newmenu);
}